

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestEventStream.cpp
# Opt level: O1

ostream * binlog::operator<<(ostream *out,ClockSync *a)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"ClockSync{",10);
  std::__ostream_insert<char,std::char_traits<char>>(out,"clockValue: ",0xc);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"clockFrequency: ",0x10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"nsSinceEpoch: ",0xe);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"tzOffset: ",10);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,a->tzOffset);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"tzName: ",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(a->tzName)._M_dataplus._M_p,(a->tzName)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," }",2);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ClockSync& a)
{
  return
  out << "ClockSync{"
      << "clockValue: " << a.clockValue
      << "clockFrequency: " << a.clockFrequency
      << "nsSinceEpoch: " << a.nsSinceEpoch
      << "tzOffset: " << a.tzOffset
      << "tzName: " << a.tzName << " }";
}